

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkDouble(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  long *plVar2;
  Abc_Obj_t *pAVar3;
  uint uVar4;
  int iVar5;
  Abc_Ntk_t *pNtkNew;
  char *pcVar6;
  ulong uVar7;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  long lVar10;
  char Buffer [500];
  char acStack_228 [504];
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                  ,0x2a4,"Abc_Ntk_t *Abc_NtkDouble(Abc_Ntk_t *)");
  }
  pNtkNew = Abc_NtkAlloc(ABC_NTK_LOGIC,pNtk->ntkFunc,1);
  sprintf(acStack_228,"%s%s",pNtk->pName,"_2x");
  pcVar6 = Extra_UtilStrsav(acStack_228);
  pNtkNew->pName = pcVar6;
  Abc_NtkCleanCopy(pNtk);
  pVVar8 = pNtk->vPis;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      Abc_NtkDupObj(pNtkNew,(Abc_Obj_t *)pVVar8->pArray[lVar10],0);
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vPis;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vPos;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      Abc_NtkDupObj(pNtkNew,(Abc_Obj_t *)pVVar8->pArray[lVar10],0);
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vPos;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vBoxes;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      Abc_NtkDupBox(pNtkNew,(Abc_Obj_t *)pVVar8->pArray[lVar10],0);
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vBoxes;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pVVar8->pArray[lVar10];
      if ((pAVar1 != (Abc_Obj_t *)0x0) && ((pAVar1->field_6).pTemp == (void *)0x0)) {
        Abc_NtkDupObj(pNtkNew,pAVar1,0);
      }
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      plVar2 = (long *)pVVar8->pArray[lVar10];
      if ((((plVar2 != (long *)0x0) && ((*(uint *)((long)plVar2 + 0x14) & 0xe) != 8)) &&
          (uVar4 = *(uint *)((long)plVar2 + 0x14) & 0xf, uVar4 != 5)) &&
         ((uVar4 != 10 && (0 < *(int *)((long)plVar2 + 0x1c))))) {
        lVar9 = 0;
        do {
          Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],
                          *(Abc_Obj_t **)
                           (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                     (long)*(int *)(plVar2[4] + lVar9 * 4) * 8) + 0x40));
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)((long)plVar2 + 0x1c));
      }
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar10 < pVVar8->nSize);
  }
  Abc_NtkCleanCopy(pNtk);
  pVVar8 = pNtk->vPis;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      Abc_NtkDupObj(pNtkNew,(Abc_Obj_t *)pVVar8->pArray[lVar10],0);
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vPis;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vPos;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      Abc_NtkDupObj(pNtkNew,(Abc_Obj_t *)pVVar8->pArray[lVar10],0);
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vPos;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vBoxes;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      Abc_NtkDupBox(pNtkNew,(Abc_Obj_t *)pVVar8->pArray[lVar10],0);
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vBoxes;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pVVar8->pArray[lVar10];
      if ((pAVar1 != (Abc_Obj_t *)0x0) && ((pAVar1->field_6).pTemp == (void *)0x0)) {
        Abc_NtkDupObj(pNtkNew,pAVar1,0);
      }
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      plVar2 = (long *)pVVar8->pArray[lVar10];
      if ((((plVar2 != (long *)0x0) && ((*(uint *)((long)plVar2 + 0x14) & 0xe) != 8)) &&
          (uVar4 = *(uint *)((long)plVar2 + 0x14) & 0xf, uVar4 != 5)) &&
         ((uVar4 != 10 && (0 < *(int *)((long)plVar2 + 0x1c))))) {
        lVar9 = 0;
        do {
          Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],
                          *(Abc_Obj_t **)
                           (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                     (long)*(int *)(plVar2[4] + lVar9 * 4) * 8) + 0x40));
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)((long)plVar2 + 0x1c));
      }
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vCis;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      if (pNtkNew->vCis->nSize <= lVar10) goto LAB_00870f17;
      pAVar1 = (Abc_Obj_t *)pVVar8->pArray[lVar10];
      pAVar3 = (Abc_Obj_t *)pNtkNew->vCis->pArray[lVar10];
      pcVar6 = Abc_ObjName(pAVar1);
      Abc_ObjAssignName(pAVar3,"1_",pcVar6);
      uVar7 = (ulong)(uint)pNtk->vCis->nSize + lVar10;
      iVar5 = (int)uVar7;
      if ((iVar5 < 0) || (pNtkNew->vCis->nSize <= iVar5)) goto LAB_00870f17;
      pAVar3 = (Abc_Obj_t *)pNtkNew->vCis->pArray[uVar7 & 0xffffffff];
      pcVar6 = Abc_ObjName(pAVar1);
      Abc_ObjAssignName(pAVar3,"2_",pcVar6);
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vCis;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      if (pNtkNew->vCos->nSize <= lVar10) {
LAB_00870f17:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar1 = (Abc_Obj_t *)pVVar8->pArray[lVar10];
      pAVar3 = (Abc_Obj_t *)pNtkNew->vCos->pArray[lVar10];
      pcVar6 = Abc_ObjName(pAVar1);
      Abc_ObjAssignName(pAVar3,"1_",pcVar6);
      uVar7 = (ulong)(uint)pNtk->vCos->nSize + lVar10;
      iVar5 = (int)uVar7;
      if ((iVar5 < 0) || (pNtkNew->vCos->nSize <= iVar5)) goto LAB_00870f17;
      pAVar3 = (Abc_Obj_t *)pNtkNew->vCos->pArray[uVar7 & 0xffffffff];
      pcVar6 = Abc_ObjName(pAVar1);
      Abc_ObjAssignName(pAVar3,"2_",pcVar6);
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar10 < pVVar8->nSize);
  }
  Abc_NtkOrderCisCos(pNtkNew);
  iVar5 = Abc_NtkCheck(pNtkNew);
  if (iVar5 == 0) {
    fwrite("Abc_NtkDup(): Network check has failed.\n",0x28,1,_stdout);
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkDouble( Abc_Ntk_t * pNtk )
{
    char Buffer[500];
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    sprintf( Buffer, "%s%s", pNtk->pName, "_2x" );
    pNtkNew->pName = Extra_UtilStrsav(Buffer);

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, 0 );
    // copy the internal nodes
    // duplicate the nets and nodes (CIs/COs/latches already dupped)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy == NULL )
            Abc_NtkDupObj(pNtkNew, pObj, 0);
    // reconnect all objects (no need to transfer attributes on edges)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, 0 );
    // copy the internal nodes
    // duplicate the nets and nodes (CIs/COs/latches already dupped)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy == NULL )
            Abc_NtkDupObj(pNtkNew, pObj, 0);
    // reconnect all objects (no need to transfer attributes on edges)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // assign names
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        Abc_ObjAssignName( Abc_NtkCi(pNtkNew,                      i), "1_", Abc_ObjName(pObj) );
        Abc_ObjAssignName( Abc_NtkCi(pNtkNew, Abc_NtkCiNum(pNtk) + i), "2_", Abc_ObjName(pObj) );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Abc_ObjAssignName( Abc_NtkCo(pNtkNew,                      i), "1_", Abc_ObjName(pObj) );
        Abc_ObjAssignName( Abc_NtkCo(pNtkNew, Abc_NtkCoNum(pNtk) + i), "2_", Abc_ObjName(pObj) );
    }
    Abc_NtkOrderCisCos( pNtkNew );

    // perform the final check
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkDup(): Network check has failed.\n" );
    return pNtkNew;
}